

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

bool __thiscall
CKey::Sign(CKey *this,uint256 *hash,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,
          bool grind,uint32_t test_case)

{
  long lVar1;
  array<unsigned_char,_32UL> *paVar2;
  bool bVar3;
  int iVar4;
  uint32_t x;
  uchar *noncedata;
  long in_FS_OFFSET;
  size_t nSigLen;
  secp256k1_pubkey pk;
  secp256k1_ecdsa_signature sig;
  uchar extra_entropy [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  paVar2 = (this->keydata)._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  if (paVar2 != (array<unsigned_char,_32UL> *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(vchSig,0x48);
    nSigLen = 0x48;
    extra_entropy[0x10] = '\0';
    extra_entropy[0x11] = '\0';
    extra_entropy[0x12] = '\0';
    extra_entropy[0x13] = '\0';
    extra_entropy[0x14] = '\0';
    extra_entropy[0x15] = '\0';
    extra_entropy[0x16] = '\0';
    extra_entropy[0x17] = '\0';
    extra_entropy[0x18] = '\0';
    extra_entropy[0x19] = '\0';
    extra_entropy[0x1a] = '\0';
    extra_entropy[0x1b] = '\0';
    extra_entropy[0x1c] = '\0';
    extra_entropy[0x1d] = '\0';
    extra_entropy[0x1e] = '\0';
    extra_entropy[0x1f] = '\0';
    extra_entropy[0] = '\0';
    extra_entropy[1] = '\0';
    extra_entropy[2] = '\0';
    extra_entropy[3] = '\0';
    extra_entropy[4] = '\0';
    extra_entropy[5] = '\0';
    extra_entropy[6] = '\0';
    extra_entropy[7] = '\0';
    extra_entropy[8] = '\0';
    extra_entropy[9] = '\0';
    extra_entropy[10] = '\0';
    extra_entropy[0xb] = '\0';
    extra_entropy[0xc] = '\0';
    extra_entropy[0xd] = '\0';
    extra_entropy[0xe] = '\0';
    extra_entropy[0xf] = '\0';
    WriteLE32(extra_entropy,test_case);
    noncedata = extra_entropy;
    if (grind) {
      noncedata = (uchar *)0x0;
    }
    if (test_case == 0) {
      noncedata = (uchar *)0x0;
    }
    iVar4 = secp256k1_ecdsa_sign
                      (secp256k1_context_sign,&sig,(uchar *)hash,
                       ((this->keydata)._M_t.
                        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                       _M_head_impl)->_M_elems,nonce_function_rfc6979,noncedata);
    x = 1;
    while( true ) {
      if (iVar4 == 0) {
        __assert_fail("ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                      ,0xe0,
                      "bool CKey::Sign(const uint256 &, std::vector<unsigned char> &, bool, uint32_t) const"
                     );
      }
      bVar3 = SigHasLowR(&sig);
      if (bVar3 || !grind) break;
      WriteLE32(extra_entropy,x);
      iVar4 = secp256k1_ecdsa_sign
                        (secp256k1_context_sign,&sig,(uchar *)hash,
                         ((this->keydata)._M_t.
                          super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                         _M_head_impl)->_M_elems,nonce_function_rfc6979,extra_entropy);
      x = x + 1;
    }
    secp256k1_ecdsa_signature_serialize_der
              (secp256k1_context_sign,
               (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,&nSigLen,&sig);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(vchSig,nSigLen);
    iVar4 = secp256k1_ec_pubkey_create
                      (secp256k1_context_sign,&pk,
                       ((this->keydata)._M_t.
                        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                       _M_head_impl)->_M_elems);
    if (iVar4 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0xe6,
                    "bool CKey::Sign(const uint256 &, std::vector<unsigned char> &, bool, uint32_t) const"
                   );
    }
    iVar4 = secp256k1_ecdsa_verify(secp256k1_context_static,&sig,(uchar *)hash,&pk);
    if (iVar4 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0xe8,
                    "bool CKey::Sign(const uint256 &, std::vector<unsigned char> &, bool, uint32_t) const"
                   );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return paVar2 != (array<unsigned_char,_32UL> *)0x0;
}

Assistant:

bool CKey::Sign(const uint256 &hash, std::vector<unsigned char>& vchSig, bool grind, uint32_t test_case) const {
    if (!keydata)
        return false;
    vchSig.resize(CPubKey::SIGNATURE_SIZE);
    size_t nSigLen = CPubKey::SIGNATURE_SIZE;
    unsigned char extra_entropy[32] = {0};
    WriteLE32(extra_entropy, test_case);
    secp256k1_ecdsa_signature sig;
    uint32_t counter = 0;
    int ret = secp256k1_ecdsa_sign(secp256k1_context_sign, &sig, hash.begin(), UCharCast(begin()), secp256k1_nonce_function_rfc6979, (!grind && test_case) ? extra_entropy : nullptr);

    // Grind for low R
    while (ret && !SigHasLowR(&sig) && grind) {
        WriteLE32(extra_entropy, ++counter);
        ret = secp256k1_ecdsa_sign(secp256k1_context_sign, &sig, hash.begin(), UCharCast(begin()), secp256k1_nonce_function_rfc6979, extra_entropy);
    }
    assert(ret);
    secp256k1_ecdsa_signature_serialize_der(secp256k1_context_sign, vchSig.data(), &nSigLen, &sig);
    vchSig.resize(nSigLen);
    // Additional verification step to prevent using a potentially corrupted signature
    secp256k1_pubkey pk;
    ret = secp256k1_ec_pubkey_create(secp256k1_context_sign, &pk, UCharCast(begin()));
    assert(ret);
    ret = secp256k1_ecdsa_verify(secp256k1_context_static, &sig, hash.begin(), &pk);
    assert(ret);
    return true;
}